

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Assignment.h
# Opt level: O3

void __thiscall
Assignment::Assignment
          (Assignment *this,ptr<Operation> *operation,ptr<Expression> *left,ptr<Expression> *right)

{
  ptr<Expression> local_48;
  ptr<Expression> local_38;
  ptr<Operation> local_28;
  
  local_28.super___shared_ptr<Operation,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (operation->super___shared_ptr<Operation,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_28.super___shared_ptr<Operation,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (operation->super___shared_ptr<Operation,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if (local_28.super___shared_ptr<Operation,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_28.super___shared_ptr<Operation,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_28.super___shared_ptr<Operation,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                     ._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_28.super___shared_ptr<Operation,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_28.super___shared_ptr<Operation,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                     ._M_pi)->_M_use_count + 1;
    }
  }
  local_38.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (left->super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_38.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (left->super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if (local_38.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_38.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_38.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_38.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_38.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  local_48.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (right->super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_48.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (right->super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if (local_48.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_48.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_48.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_48.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_48.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  BinaryOperator::BinaryOperator(&this->super_BinaryOperator,&local_28,&local_38,&local_48);
  if (local_48.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_48.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
              );
  }
  if (local_38.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_38.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
              );
  }
  if (local_28.super___shared_ptr<Operation,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_28.super___shared_ptr<Operation,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
    ;
  }
  (this->super_BinaryOperator).super_Expression._vptr_Expression =
       (_func_int **)&PTR_evaluate_0012faf0;
  return;
}

Assistant:

Assignment(ptr<Operation> operation, ptr<Expression> left, ptr<Expression> right) : BinaryOperator(operation, left, right) { }